

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

int __thiscall asmjit::_abi_1_10::Zone::dup(Zone *this,int __fd)

{
  void *__dest;
  byte in_CL;
  size_t in_RDX;
  undefined4 in_register_00000034;
  
  __dest = (void *)0x0;
  if (((void *)CONCAT44(in_register_00000034,__fd) != (void *)0x0) && (in_RDX != 0)) {
    if (in_RDX == 0xffffffffffffffff) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zone.cpp"
                 ,0xb1,"size != SIZE_MAX");
    }
    __dest = alloc(this,in_CL + in_RDX,1);
    if (__dest == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      memcpy(__dest,(void *)CONCAT44(in_register_00000034,__fd),in_RDX);
      if (in_CL != 0) {
        *(undefined1 *)((long)__dest + in_RDX) = 0;
      }
    }
  }
  return (int)__dest;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size))
    return nullptr;

  ASMJIT_ASSERT(size != SIZE_MAX);
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}